

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O2

vector<Class,_std::allocator<Class>_> * __thiscall
Population::crossover
          (vector<Class,_std::allocator<Class>_> *__return_storage_ptr__,Population *this,
          vector<Class,_std::allocator<Class>_> *classes1,
          vector<Class,_std::allocator<Class>_> *classes2)

{
  pointer pCVar1;
  result_type_conflict1 rVar2;
  ulong uVar3;
  long lVar4;
  uniform_int_distribution<int> int_distribution;
  uniform_int_distribution<int> local_110;
  Class local_108;
  
  (__return_storage_ptr__->super__Vector_base<Class,_std::allocator<Class>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Class,_std::allocator<Class>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Class,_std::allocator<Class>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_110._M_param._M_a = 0;
  local_110._M_param._M_b =
       (int)(((long)(classes1->super__Vector_base<Class,_std::allocator<Class>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(classes1->super__Vector_base<Class,_std::allocator<Class>_>)._M_impl.
                   super__Vector_impl_data._M_start) / 0xd8);
  random_engine();
  rVar2 = std::uniform_int_distribution<int>::operator()(&local_110,&random_engine::smt);
  lVar4 = 0;
  for (uVar3 = 0;
      pCVar1 = (classes1->super__Vector_base<Class,_std::allocator<Class>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)(((long)(classes1->super__Vector_base<Class,_std::allocator<Class>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)pCVar1) / 0xd8);
      uVar3 = uVar3 + 1) {
    if ((long)uVar3 < (long)rVar2) {
      crossover(&local_108,(Population *)0xd8,(Class *)((long)&(pCVar1->group).id + lVar4),
                (Class *)((long)&(((classes2->super__Vector_base<Class,_std::allocator<Class>_>).
                                   _M_impl.super__Vector_impl_data._M_start)->group).id + lVar4));
      std::vector<Class,_std::allocator<Class>_>::emplace_back<Class>
                (__return_storage_ptr__,&local_108);
    }
    else {
      crossover(&local_108,(Population *)0xd8,
                (Class *)((long)&(((classes2->super__Vector_base<Class,_std::allocator<Class>_>).
                                   _M_impl.super__Vector_impl_data._M_start)->group).id + lVar4),
                (Class *)((long)&(pCVar1->group).id + lVar4));
      std::vector<Class,_std::allocator<Class>_>::emplace_back<Class>
                (__return_storage_ptr__,&local_108);
    }
    Class::~Class(&local_108);
    lVar4 = lVar4 + 0xd8;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Class> Population::crossover(const vector<Class>& classes1,
                                    const vector<Class>& classes2) const {
    vector<Class> classes;
    uniform_int_distribution<int> int_distribution(0, classes1.size());
    int border = int_distribution(random_engine());
    for (int i = 0; i < classes1.size(); ++i) {
        if (i < border) {
            classes.push_back(crossover(classes1[i], classes2[i]));
        } else {
            classes.push_back(crossover(classes2[i], classes1[i]));
        }
    }
    return classes;
}